

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,vector_bagwell<unsigned_char_*,_16U> *bucket,
          size_t depth)

{
  pointer pppuVar1;
  ushort uVar2;
  TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *this_00;
  uchar *puVar3;
  vector_bagwell<unsigned_char_*,_16U> *pvVar4;
  ulong uVar5;
  uint index;
  uint j;
  long lVar6;
  uchar **t;
  size_t index_00;
  ulong uVar7;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  ushort auStack_2b0 [64];
  uchar *local_230 [64];
  
  this_00 = (TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = 0;
  uVar5 = 0;
  if (bucket->_insertpos != (uchar **)0x0) {
    pppuVar1 = (bucket->_index_block).
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar5 = (long)bucket->_insertpos +
            ((ulong)((1 << ((char)((uint)((int)pppuVar1 -
                                         *(int *)&(bucket->_index_block).
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                            3U & 0x1f)) - 0x10) * 8 - (long)pppuVar1[-1]) >> 3;
  }
  if ((uVar5 & 0xffffffc0) != 0) {
    uVar7 = 0;
    do {
      lVar6 = 0;
      do {
        puVar3 = vector_bagwell<unsigned_char_*,_16U>::operator[](bucket,lVar6 + uVar7);
        local_230[lVar6] = puVar3;
        if (puVar3 == (uchar *)0x0) goto LAB_001a3968;
        if (puVar3[depth] == '\0') {
          uVar2 = 0;
        }
        else {
          uVar2 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
        }
        auStack_2b0[lVar6] = uVar2;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x40);
      t = local_230;
      lVar6 = 0;
      do {
        pvVar4 = TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_>::get_bucket
                           (this_00,(uint)auStack_2b0[lVar6]);
        if (pvVar4 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
          __assert_fail("sub_bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x78,
                        "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_bagwell<unsigned char *>]"
                       );
        }
        vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar4,t);
        lVar6 = lVar6 + 1;
        t = t + 1;
      } while (lVar6 != 0x40);
      uVar7 = uVar7 + 0x40;
    } while (uVar7 < ((uint)uVar5 & 0xffffffc0));
  }
  if ((uint)uVar7 < (uint)uVar5) {
    index_00 = uVar7 & 0xffffffff;
    do {
      local_230[0] = vector_bagwell<unsigned_char_*,_16U>::operator[](bucket,index_00);
      if (local_230[0] == (uchar *)0x0) {
LAB_001a3968:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (local_230[0][depth] == '\0') {
        index = 0;
      }
      else {
        index = (uint)CONCAT11(local_230[0][depth],local_230[0][depth + 1]);
      }
      pvVar4 = TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_>::get_bucket
                         (this_00,index);
      if (pvVar4 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x80,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_bagwell<unsigned char *>]"
                     );
      }
      vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar4,local_230);
      index_00 = index_00 + 1;
    } while ((uVar5 & 0xffffffff) != index_00);
  }
  return this_00;
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}